

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
int_writer<unsigned_long,_fmt::v5::basic_format_specs<wchar_t>_>::on_dec
          (int_writer<unsigned_long,_fmt::v5::basic_format_specs<wchar_t>_> *this)

{
  ulong uVar1;
  long lVar2;
  dec_writer f;
  uint uVar3;
  int num_digits;
  string_view prefix;
  undefined4 uStack_4;
  
  uVar1 = this->abs_value;
  lVar2 = 0x3f;
  if ((uVar1 | 1) != 0) {
    for (; (uVar1 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  uVar3 = ((uint)lVar2 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  num_digits = (uVar3 + 1) -
               (uint)(uVar1 < *(ulong *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_64 +
                                        (ulong)uVar3 * 8));
  f._12_4_ = uStack_4;
  f.num_digits = num_digits;
  f.abs_value = uVar1;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
  write_int<fmt::v5::basic_format_specs<wchar_t>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *)
             this->writer,num_digits,prefix,this->spec,f);
  return;
}

Assistant:

void on_dec() {
      int num_digits = internal::count_digits(abs_value);
      writer.write_int(num_digits, get_prefix(), spec,
                       dec_writer{abs_value, num_digits});
    }